

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall
QMenuPrivate::scrollMenu(QMenuPrivate *this,ScrollDirection direction,bool page,bool active)

{
  quint8 *pqVar1;
  QWidget *this_00;
  QWidget *pQVar2;
  ulong uVar3;
  long lVar4;
  QRect *pQVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QStyle *pQVar11;
  ScrollLocation location;
  long lVar12;
  QAction *action;
  Representation *pRVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  long in_FS_OFFSET;
  int local_50;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->scroll != (QMenuScroller *)0x0) &&
     ((this->scroll->scrollFlags & direction) != ScrollNone)) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    local_50 = 0;
    local_48 = popupGeometry(this,(QScreen *)0x0);
    updateActionRects(this,&local_48);
    bVar7 = this->scroll->scrollFlags;
    iVar8 = 0;
    if ((bVar7 & 1) != 0) {
      pQVar2 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      pQVar11 = QWidget::style(pQVar2);
      iVar8 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x1b,0,pQVar2);
      bVar7 = this->scroll->scrollFlags;
    }
    if ((bVar7 & 2) != 0) {
      pQVar2 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      pQVar11 = QWidget::style(pQVar2);
      local_50 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x1b,0,pQVar2);
    }
    pQVar11 = QWidget::style(this_00);
    iVar9 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x1d,0,this_00);
    pQVar11 = QWidget::style(this_00);
    iVar10 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x1e,0,this_00);
    iVar9 = iVar8 - iVar9;
    if (iVar8 == 0) {
      iVar9 = 0;
    }
    if (direction == ScrollUp) {
      lVar4 = (this->super_QWidgetPrivate).actions.d.size;
      if (lVar4 != 0) {
        pQVar5 = (this->actionRects).d.ptr;
        lVar12 = 0;
        iVar8 = 0;
        do {
          iVar8 = iVar8 + ~*(uint *)((long)&(pQVar5->y2).m_i + lVar12 * 2) +
                  *(int *)((long)&(pQVar5->y1).m_i + lVar12 * 2);
          if (iVar8 <= this->scroll->scrollOffset - iVar9) {
            action = *(QAction **)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar12);
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00458833;
            location = ScrollTop - page;
            goto LAB_0045881d;
          }
          lVar12 = lVar12 + 8;
        } while (lVar4 << 3 != lVar12);
      }
    }
    else if (direction == ScrollDown) {
      uVar3 = (this->super_QWidgetPrivate).actions.d.size;
      if (uVar3 != 0) {
        location = page + ScrollBottom;
        iVar14 = this->scroll->scrollOffset;
        pRVar13 = &(this->actionRects).d.ptr[1].y2;
        iVar17 = 0;
        uVar15 = 1;
        do {
          iVar17 = iVar17 + ~*(uint *)(pRVar13 + -4) + pRVar13[-6].m_i;
          if (iVar17 <= iVar14 - iVar9) {
            iVar14 = iVar14 - (iVar17 + iVar9);
            goto LAB_004587b2;
          }
          pRVar13 = pRVar13 + 4;
          bVar6 = uVar15 < uVar3;
          uVar15 = uVar15 + 1;
        } while (bVar6);
      }
LAB_0045870a:
      pqVar1 = &this->scroll->scrollFlags;
      *pqVar1 = *pqVar1 & 0xfd;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QWidget::update(this_00);
        return;
      }
      goto LAB_00458833;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  goto LAB_00458833;
  while( true ) {
    iVar14 = ((iVar14 + pRVar13->m_i) - pRVar13[-2].m_i) + 1;
    pRVar13 = pRVar13 + 4;
    uVar15 = uVar16 + 1;
    if (((1 - (iVar8 + local_50 + iVar10 * 2)) + (this_00->data->crect).y2.m_i) -
        (this_00->data->crect).y1.m_i < iVar14) break;
LAB_004587b2:
    uVar16 = uVar15;
    if (uVar3 <= uVar16) goto LAB_0045870a;
  }
  action = (this->super_QWidgetPrivate).actions.d.ptr[uVar16];
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_0045881d:
    scrollMenu(this,action,location,active);
    return;
  }
LAB_00458833:
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::scrollMenu(QMenuScroller::ScrollDirection direction, bool page, bool active)
{
    Q_Q(QMenu);
    if (!scroll || !(scroll->scrollFlags & direction)) //not really possible...
        return;
    updateActionRects();
    const int topScroll = (scroll->scrollFlags & QMenuScroller::ScrollUp)   ? scrollerHeight() : 0;
    const int botScroll = (scroll->scrollFlags & QMenuScroller::ScrollDown) ? scrollerHeight() : 0;
    const int vmargin = q->style()->pixelMetric(QStyle::PM_MenuVMargin, nullptr, q);
    const int fw = q->style()->pixelMetric(QStyle::PM_MenuPanelWidth, nullptr, q);
    const int offset = topScroll ? topScroll-vmargin : 0;
    if (direction == QMenuScroller::ScrollUp) {
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            saccum -= actionRects.at(i).height();
            if (saccum <= scroll->scrollOffset-offset) {
                scrollMenu(actions.at(i), page ? QMenuScroller::ScrollBottom : QMenuScroller::ScrollTop, active);
                break;
            }
        }
    } else if (direction == QMenuScroller::ScrollDown) {
        bool scrolled = false;
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            const int iHeight = actionRects.at(i).height();
            saccum -= iHeight;
            if (saccum <= scroll->scrollOffset-offset) {
                const int scrollerArea = q->height() - botScroll - fw*2;
                int visible = (scroll->scrollOffset-offset) - saccum;
                for(i++ ; i < actions.size(); i++) {
                    visible += actionRects.at(i).height();
                    if (visible > scrollerArea - topScroll) {
                        scrolled = true;
                        scrollMenu(actions.at(i), page ? QMenuScroller::ScrollTop : QMenuScroller::ScrollBottom, active);
                        break;
                    }
                }
                break;
            }
        }
        if (!scrolled) {
            scroll->scrollFlags &= ~QMenuScroller::ScrollDown;
            q->update();
        }
    }
}